

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationZ.hpp
# Opt level: O1

void __thiscall
qclab::qgates::CRotationZ<std::complex<double>_>::CRotationZ
          (CRotationZ<std::complex<double>_> *this,int control,int target,real_type theta,
          int controlState)

{
  QRotationGate1<std::complex<double>_> *this_00;
  char *__assertion;
  
  QControlledGate2<std::complex<double>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<double>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_005264c0;
  this_00 = (QRotationGate1<std::complex<double>_> *)operator_new(0x20);
  QRotationGate1<std::complex<double>_>::QRotationGate1(this_00,target,theta,false);
  (this_00->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_> =
       (QObject<std::complex<double>_>)&PTR_nbQubits_00522d48;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::RotationZ<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<double>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::RotationZ<std::complex<double>_>_*,_std::default_delete<qclab::qgates::RotationZ<std::complex<double>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::RotationZ<std::complex<double>_>_*,_false>._M_head_impl =
       (RotationZ<std::complex<double>_> *)this_00;
  if (control < 0) {
    __assertion = "control >= 0";
  }
  else {
    if (-1 < target) {
      if (target != control) {
        return;
      }
      __assert_fail("control != target",
                    "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CRotationZ.hpp"
                    ,0x41,
                    "qclab::qgates::CRotationZ<std::complex<double>>::CRotationZ(const int, const int, const real_type, const int) [T = std::complex<double>]"
                   );
    }
    __assertion = "target >= 0";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CRotationZ.hpp"
                ,0x40,
                "qclab::qgates::CRotationZ<std::complex<double>>::CRotationZ(const int, const int, const real_type, const int) [T = std::complex<double>]"
               );
}

Assistant:

CRotationZ( const int control , const int target ,
                    const real_type theta , const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< RotationZ< T > >( target , theta ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }